

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.hpp
# Opt level: O0

void __thiscall lightconf::scanner::expect(scanner *this,char c,bool optional)

{
  char cVar1;
  bool bVar2;
  token *tok;
  token local_1d0;
  token local_190;
  token local_150;
  string local_110;
  allocator local_e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  token local_58;
  byte local_12;
  char local_11;
  bool optional_local;
  scanner *psStack_10;
  char c_local;
  scanner *this_local;
  
  local_12 = optional;
  local_11 = c;
  psStack_10 = this;
  peek_token(&local_58,this);
  bVar2 = token::is_char(&local_58,local_11);
  token::~token(&local_58);
  cVar1 = local_11;
  if (bVar2) {
    skip_whitespace(this,false);
    next_token(this);
  }
  else if ((local_12 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_e8,1,cVar1,&local_e9);
    std::operator+(&local_c8,"expected \'",&local_e8);
    std::operator+(&local_a8,&local_c8,"\' but found ");
    cur_token(&local_150,this);
    token_name_abi_cxx11_(&local_110,(lightconf *)&local_150,tok);
    std::operator+(&local_88,&local_a8,&local_110);
    cur_token(&local_190,this);
    cur_token(&local_1d0,this);
    fail(this,&local_88,local_190.line,local_1d0.col);
    token::~token(&local_1d0);
    token::~token(&local_190);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_110);
    token::~token(&local_150);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  }
  return;
}

Assistant:

inline void scanner::expect(char c, bool optional) {
    if (peek_token().is_char(c)) {
        skip_whitespace(false);
        next_token();
    } else {
        if (!optional) {
            fail("expected '" + std::string(1, c) + "' but found " + token_name(cur_token()),
                cur_token().line, cur_token().col);
        }
    }
}